

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O3

pqpair student_s2pq(double xx,double dof)

{
  double dVar1;
  pqpair pVar2;
  int which;
  double xlam;
  double s;
  double q;
  double p;
  int status;
  double bound;
  int local_44;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  int local_1c;
  double local_18;
  
  local_44 = 1;
  local_28 = 0.0;
  local_30 = 1.0;
  dVar1 = 0.0;
  if (dof <= 0.0) {
    local_30 = 1.0;
  }
  else {
    local_40 = dof;
    local_38 = xx;
    cdft(&local_44,&local_28,&local_30,&local_38,&local_40,&local_1c,&local_18);
    dVar1 = local_28;
  }
  pVar2.q = local_30;
  pVar2.p = dVar1;
  return pVar2;
}

Assistant:

static pqpair student_s2pq( double xx , double dof )
{
   int which , status ;
   double p,q, s,xlam,bound ;
   pqpair pq={0.0,1.0} ;

   which  = 1 ;
   p      = 0.0 ;
   q      = 1.0 ;
   s      = xx ;
   xlam   = dof ;  if( xlam <= 0.0 ) return pq ;

   cdft( &which , &p , &q , &s , &xlam , &status , &bound ) ;
   pq.p = p ; pq.q = q ; return pq ;
}